

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# temporal_filter.c
# Opt level: O0

_Bool av1_tf_info_alloc(TEMPORAL_FILTER_INFO *tf_info,AV1_COMP *cpi)

{
  int iVar1;
  long in_RSI;
  int *in_RDI;
  int i;
  SequenceHeader *seq_params;
  AV1_COMMON *cm;
  AV1EncoderConfig *oxcf;
  _Bool in_stack_00000083;
  int in_stack_00000084;
  int in_stack_00000088;
  int in_stack_0000008c;
  int in_stack_00000090;
  int in_stack_00000094;
  YV12_BUFFER_CONFIG *in_stack_00000098;
  int in_stack_000000e0;
  int in_stack_000000e8;
  aom_codec_frame_buffer_t *in_stack_000000f0;
  aom_get_frame_buffer_cb_fn_t in_stack_000000f8;
  void *in_stack_00000100;
  int in_stack_00000110;
  int local_3c;
  
  iVar1 = av1_is_temporal_filter_on((AV1EncoderConfig *)(in_RSI + 0x42320));
  *in_RDI = iVar1;
  if (*in_RDI != 0) {
    for (local_3c = 0; local_3c < 2; local_3c = local_3c + 1) {
      iVar1 = aom_realloc_frame_buffer
                        (in_stack_00000098,in_stack_00000094,in_stack_00000090,in_stack_0000008c,
                         in_stack_00000088,in_stack_00000084,in_stack_000000e0,in_stack_000000e8,
                         in_stack_000000f0,in_stack_000000f8,in_stack_00000100,in_stack_00000083,
                         in_stack_00000110);
      if (iVar1 != 0) {
        return false;
      }
    }
  }
  return true;
}

Assistant:

bool av1_tf_info_alloc(TEMPORAL_FILTER_INFO *tf_info, const AV1_COMP *cpi) {
  const AV1EncoderConfig *oxcf = &cpi->oxcf;
  tf_info->is_temporal_filter_on = av1_is_temporal_filter_on(oxcf);
  if (tf_info->is_temporal_filter_on == 0) return true;

  const AV1_COMMON *cm = &cpi->common;
  const SequenceHeader *const seq_params = cm->seq_params;
  for (int i = 0; i < TF_INFO_BUF_COUNT; ++i) {
    if (aom_realloc_frame_buffer(
            &tf_info->tf_buf[i], oxcf->frm_dim_cfg.width,
            oxcf->frm_dim_cfg.height, seq_params->subsampling_x,
            seq_params->subsampling_y, seq_params->use_highbitdepth,
            cpi->oxcf.border_in_pixels, cm->features.byte_alignment, NULL, NULL,
            NULL, cpi->alloc_pyramid, 0)) {
      return false;
    }
  }
  return true;
}